

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompareNodeSets
              (xmlXPathParserContextPtr ctxt,int inf,int strict,xmlXPathObjectPtr arg1,
              xmlXPathObjectPtr arg2)

{
  xmlNodeSetPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  
  if ((arg1->type | XPATH_USERS) == XPATH_XSLT_TREE) {
    if (((((arg2->type | XPATH_USERS) == XPATH_XSLT_TREE) &&
         (pxVar1 = arg1->nodesetval, pxVar1 != (xmlNodeSetPtr)0x0)) && (0 < pxVar1->nodeNr)) &&
       ((pxVar2 = arg2->nodesetval, pxVar2 != (xmlNodeSetPtr)0x0 && (0 < (long)pxVar2->nodeNr)))) {
      pvVar6 = (*xmlMalloc)((long)pxVar2->nodeNr << 3);
      if (pvVar6 != (void *)0x0) {
        if (0 < pxVar1->nodeNr) {
          bVar9 = strict != 0;
          bVar10 = inf == 0;
          lVar8 = 0;
          bVar3 = false;
          do {
            dVar11 = xmlXPathNodeToNumberInternal(ctxt,pxVar1->nodeTab[lVar8]);
            if (!NAN(dVar11)) {
              uVar5 = 0;
              if (0 < pxVar2->nodeNr) {
                lVar7 = 0;
                do {
                  if (!bVar3) {
                    dVar12 = xmlXPathNodeToNumberInternal(ctxt,pxVar2->nodeTab[lVar7]);
                    *(double *)((long)pvVar6 + lVar7 * 8) = dVar12;
                  }
                  dVar12 = *(double *)((long)pvVar6 + lVar7 * 8);
                  if (!NAN(dVar12)) {
                    if (bVar10 || !bVar9) {
                      if (bVar10 || bVar9) {
                        if (bVar10 && bVar9) {
                          bVar4 = dVar11 < dVar12;
                          goto LAB_001c03f9;
                        }
                        bVar4 = dVar12 <= dVar11 && (strict == 0 && inf == 0);
                      }
                      else {
                        bVar4 = dVar11 <= dVar12;
                      }
                    }
                    else {
                      bVar4 = dVar12 < dVar11;
LAB_001c03f9:
                      bVar4 = !bVar4 && dVar12 != dVar11;
                    }
                    if (bVar4 != false) {
                      uVar5 = (uint)bVar4;
                      goto LAB_001c044d;
                    }
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 < pxVar2->nodeNr);
                uVar5 = 0;
              }
LAB_001c044d:
              bVar3 = true;
              if (uVar5 != 0) goto LAB_001c0469;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < pxVar1->nodeNr);
        }
        uVar5 = 0;
LAB_001c0469:
        (*xmlFree)(pvVar6);
        xmlXPathFreeObject(arg1);
        xmlXPathFreeObject(arg2);
        return uVar5;
      }
      xmlXPathPErrMemory(ctxt);
    }
    xmlXPathFreeObject(arg1);
  }
  xmlXPathFreeObject(arg2);
  return 0;
}

Assistant:

static int
xmlXPathCompareNodeSets(xmlXPathParserContextPtr ctxt, int inf, int strict,
	                xmlXPathObjectPtr arg1, xmlXPathObjectPtr arg2) {
    int i, j, init = 0;
    double val1;
    double *values2;
    int ret = 0;
    xmlNodeSetPtr ns1;
    xmlNodeSetPtr ns2;

    if ((arg1 == NULL) ||
	((arg1->type != XPATH_NODESET) && (arg1->type != XPATH_XSLT_TREE))) {
	xmlXPathFreeObject(arg2);
        return(0);
    }
    if ((arg2 == NULL) ||
	((arg2->type != XPATH_NODESET) && (arg2->type != XPATH_XSLT_TREE))) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
        return(0);
    }

    ns1 = arg1->nodesetval;
    ns2 = arg2->nodesetval;

    if ((ns1 == NULL) || (ns1->nodeNr <= 0)) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	return(0);
    }
    if ((ns2 == NULL) || (ns2->nodeNr <= 0)) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	return(0);
    }

    values2 = (double *) xmlMalloc(ns2->nodeNr * sizeof(double));
    if (values2 == NULL) {
        xmlXPathPErrMemory(ctxt);
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	return(0);
    }
    for (i = 0;i < ns1->nodeNr;i++) {
	val1 = xmlXPathNodeToNumberInternal(ctxt, ns1->nodeTab[i]);
	if (xmlXPathIsNaN(val1))
	    continue;
	for (j = 0;j < ns2->nodeNr;j++) {
	    if (init == 0) {
		values2[j] = xmlXPathNodeToNumberInternal(ctxt,
                                                          ns2->nodeTab[j]);
	    }
	    if (xmlXPathIsNaN(values2[j]))
		continue;
	    if (inf && strict)
		ret = (val1 < values2[j]);
	    else if (inf && !strict)
		ret = (val1 <= values2[j]);
	    else if (!inf && strict)
		ret = (val1 > values2[j]);
	    else if (!inf && !strict)
		ret = (val1 >= values2[j]);
	    if (ret)
		break;
	}
	if (ret)
	    break;
	init = 1;
    }
    xmlFree(values2);
    xmlXPathFreeObject(arg1);
    xmlXPathFreeObject(arg2);
    return(ret);
}